

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepFaceField.h
# Opt level: O2

string * anurbs::BrepFaceField<3l>::python_name_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  std::__cxx11::to_string(&local_30,3);
  std::operator+(&local_50,"BrepFaceField",&local_30);
  std::operator+(in_RDI,&local_50,"D");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

static std::string python_name()
    {
        return "BrepFaceField" + std::to_string(dimension()) + "D";
    }